

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O3

int __thiscall
flow::IRHandler::verify
          (IRHandler *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int in_EAX;
  uchar *extraout_RDX;
  _List_node_base *p_Var1;
  
  for (p_Var1 = (this->blocks_).
                super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->blocks_; p_Var1 = p_Var1->_M_next) {
    in_EAX = BasicBlock::verify((BasicBlock *)p_Var1[1]._M_next,ctx,sig,siglen,tbs,tbslen);
    sig = extraout_RDX;
  }
  return in_EAX;
}

Assistant:

void IRHandler::verify() {
  for (std::unique_ptr<BasicBlock>& bb : blocks_) {
    bb->verify();
  }
}